

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  int iVar1;
  uint bit_1;
  uint hat_1;
  uint bit;
  uint hat;
  _GLFWjoystick *js;
  int i;
  GLFWgamepadstate *state_local;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48d,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48e,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (state == (GLFWgamepadstate *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48f,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  memset(state,0,0x28);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    state_local._4_4_ = 0;
  }
  else if ((jid < 0) || (0xf < jid)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
    state_local._4_4_ = 0;
  }
  else if (_glfw.joysticks[jid].present == 0) {
    state_local._4_4_ = 0;
  }
  else {
    iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,3);
    if (iVar1 == 0) {
      state_local._4_4_ = 0;
    }
    else if (_glfw.joysticks[jid].mapping == (_GLFWmapping *)0x0) {
      state_local._4_4_ = 0;
    }
    else {
      for (js._4_4_ = 0; js._4_4_ < 0xf; js._4_4_ = js._4_4_ + 1) {
        if ((_glfw.joysticks[jid].mapping)->buttons[js._4_4_].type == '\x01') {
          if (0.5 < ABS(_glfw.joysticks[jid].axes
                        [(_glfw.joysticks[jid].mapping)->buttons[js._4_4_].value])) {
            state->buttons[js._4_4_] = '\x01';
          }
        }
        else if ((_glfw.joysticks[jid].mapping)->buttons[js._4_4_].type == '\x03') {
          if ((_glfw.joysticks[jid].hats
               [(uint)((int)(uint)(_glfw.joysticks[jid].mapping)->buttons[js._4_4_].value >> 4)] &
              (_glfw.joysticks[jid].mapping)->buttons[js._4_4_].value & 0xf) != 0) {
            state->buttons[js._4_4_] = '\x01';
          }
        }
        else if ((_glfw.joysticks[jid].mapping)->buttons[js._4_4_].type == '\x02') {
          state->buttons[js._4_4_] =
               _glfw.joysticks[jid].buttons[(_glfw.joysticks[jid].mapping)->buttons[js._4_4_].value]
          ;
        }
      }
      for (js._4_4_ = 0; js._4_4_ < 6; js._4_4_ = js._4_4_ + 1) {
        if ((_glfw.joysticks[jid].mapping)->axes[js._4_4_].type == '\x01') {
          state->axes[js._4_4_] =
               _glfw.joysticks[jid].axes[(_glfw.joysticks[jid].mapping)->axes[js._4_4_].value];
        }
        else if ((_glfw.joysticks[jid].mapping)->buttons[js._4_4_].type == '\x03') {
          if ((_glfw.joysticks[jid].hats
               [(uint)((int)(uint)(_glfw.joysticks[jid].mapping)->axes[js._4_4_].value >> 4)] &
              (_glfw.joysticks[jid].mapping)->axes[js._4_4_].value & 0xf) != 0) {
            state->axes[js._4_4_] = 1.0;
          }
        }
        else if ((_glfw.joysticks[jid].mapping)->buttons[js._4_4_].type == '\x02') {
          state->axes[js._4_4_] =
               (float)_glfw.joysticks[jid].buttons
                      [(_glfw.joysticks[jid].mapping)->axes[js._4_4_].value];
        }
      }
      state_local._4_4_ = 1;
    }
  }
  return state_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_AXIS)
        {
            if (fabsf(js->axes[js->mapping->buttons[i].value]) > 0.5f)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = js->mapping->buttons[i].value >> 4;
            const unsigned int bit = js->mapping->buttons[i].value & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[js->mapping->buttons[i].value];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        if (js->mapping->axes[i].type == _GLFW_JOYSTICK_AXIS)
            state->axes[i] = js->axes[js->mapping->axes[i].value];
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = js->mapping->axes[i].value >> 4;
            const unsigned int bit = js->mapping->axes[i].value & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = (float) js->buttons[js->mapping->axes[i].value];
    }

    return GLFW_TRUE;
}